

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O1

mkroom * pick_room(level *lev,boolean strict)

{
  mkroom *pmVar1;
  uint uVar2;
  mkroom *pmVar3;
  ulong uVar4;
  mkroom *pmVar5;
  
  uVar4 = (ulong)lev->nroom;
  uVar2 = mt_random();
  if (uVar4 != 0) {
    pmVar1 = lev->rooms;
    pmVar3 = pmVar1 + SUB168(ZEXT416(uVar2) % SEXT816((long)uVar4),0);
    do {
      pmVar5 = pmVar1;
      if (pmVar3 != pmVar1 + lev->nroom) {
        pmVar5 = pmVar3;
      }
      if (pmVar5->hx < '\0') {
        return (mkroom *)0x0;
      }
      if (pmVar5->rtype == '\0') {
        if (strict == '\0') {
          if (((lev->upstairs_room != pmVar5) &&
              ((((lev->sstairs).sx == '\0' || ((lev->sstairs).up == '\0')) ||
               (lev->sstairs_room != pmVar5)))) &&
             (((lev->dnstairs_room != pmVar5 &&
               ((((lev->sstairs).sx == '\0' || ((lev->sstairs).up != '\0')) ||
                (lev->sstairs_room != pmVar5)))) ||
              (uVar2 = mt_random(), uVar2 * -0x55555555 < 0x55555556)))) goto LAB_001e27be;
        }
        else if (((lev->upstairs_room != pmVar5) &&
                 ((((lev->sstairs).sx == '\0' || ((lev->sstairs).up == '\0')) ||
                  (lev->sstairs_room != pmVar5)))) &&
                ((lev->dnstairs_room != pmVar5 &&
                 ((((lev->sstairs).sx == '\0' || ((lev->sstairs).up != '\0')) ||
                  (lev->sstairs_room != pmVar5)))))) {
LAB_001e27be:
          if (pmVar5->doorct == '\x01') {
            return pmVar5;
          }
          uVar2 = mt_random();
          if (uVar2 * -0x33333333 < 0x33333334) {
            return pmVar5;
          }
          if (flags.debug != '\0') {
            return pmVar5;
          }
        }
      }
      uVar2 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar2;
      pmVar3 = pmVar5 + 1;
    } while (uVar2 != 0);
  }
  return (mkroom *)0x0;
}

Assistant:

struct mkroom *pick_room(struct level *lev, boolean strict)
{
	struct mkroom *sroom;
	int i = lev->nroom;

	for (sroom = &lev->rooms[rn2(lev->nroom)]; i--; sroom++) {
		if (sroom == &lev->rooms[lev->nroom])
			sroom = &lev->rooms[0];
		if (sroom->hx < 0)
			return NULL;
		if (sroom->rtype != OROOM)	continue;
		if (!strict) {
		    if (has_upstairs(lev, sroom) || (has_dnstairs(lev, sroom) && rn2(3)))
			continue;
		} else if (has_upstairs(lev, sroom) || has_dnstairs(lev, sroom))
			continue;
		if (sroom->doorct == 1 || !rn2(5) || wizard)
			return sroom;
	}
	return NULL;
}